

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

bool __thiscall
Js::DictionaryTypeHandlerBase<int>::TryGetFixedProperty<true,false>
          (DictionaryTypeHandlerBase<int> *this,PropertyRecord *propertyRecord,Var *pProperty,
          FixedPropertyKind propertyType,ScriptContext *requestContext)

{
  RecyclerWeakReference<Js::DynamicObject> *pRVar1;
  DynamicObject *this_00;
  code *pcVar2;
  bool bVar3;
  int index;
  Var aValue;
  DictionaryPropertyDescriptor<int> *local_48;
  DictionaryPropertyDescriptor<int> *descriptor;
  PropertyRecord *local_38;
  PropertyRecord *propertyRecord_local;
  
  pRVar1 = (this->singletonInstance).ptr;
  if (((((pRVar1 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
        (this_00 = (DynamicObject *)(pRVar1->super_RecyclerWeakReferenceBase).strongRef,
        this_00 != (DynamicObject *)0x0)) &&
       ((((((this_00->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
        super_JavascriptLibraryBase).scriptContext.ptr == requestContext)) &&
      ((local_38 = propertyRecord,
       bVar3 = JsUtil::
               BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
               ::TryGetReference<Js::PropertyRecord_const*>
                         ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                           *)(this->propertyMap).ptr,&local_38,&local_48), bVar3 &&
       ((local_48->Attributes & 8) == 0)))) &&
     (((local_48->flags & IsFixed) != None &&
      (index = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>(local_48), index != -1
      )))) {
    if ((uint)local_38->pid < 0x10) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      descriptor = (DictionaryPropertyDescriptor<int> *)__tls_get_addr(&PTR_013e5f18);
      descriptor->flags = PreventFalseReference;
      descriptor->Attributes = '\0';
      *(undefined2 *)&descriptor->field_0x2 = 0;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0xa23,"(!IsInternalPropertyId(propertyRecord->GetPropertyId()))",
                                  "!IsInternalPropertyId(propertyRecord->GetPropertyId())");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      descriptor->flags = None;
      descriptor->Attributes = '\0';
      *(undefined2 *)&descriptor->field_0x2 = 0;
    }
    aValue = DynamicObject::GetSlot(this_00,index);
    if ((aValue != (Var)0x0) &&
       (((bVar3 = DynamicTypeHandler::IsFixedMethodProperty
                            (&this->super_DynamicTypeHandler,propertyType), bVar3 &&
         (bVar3 = VarIs<Js::JavascriptFunction>(aValue), bVar3)) ||
        (bVar3 = DynamicTypeHandler::IsFixedDataProperty
                           (&this->super_DynamicTypeHandler,propertyType), bVar3)))) {
      *pProperty = aValue;
      return true;
    }
  }
  return false;
}

Assistant:

bool DictionaryTypeHandlerBase<T>::TryGetFixedProperty(PropertyRecord const * propertyRecord, Var * pProperty, FixedPropertyKind propertyType, ScriptContext * requestContext)
    {
        // Note: This function is not thread-safe and cannot be called from the JIT thread.  That's why we collect and
        // cache any fixed function instances during work item creation on the main thread.
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        if (localSingletonInstance != nullptr && localSingletonInstance->GetScriptContext() == requestContext)
        {
            DictionaryPropertyDescriptor<T>* descriptor;
            if (propertyMap->TryGetReference(propertyRecord, &descriptor))
            {
                if (descriptor->Attributes & PropertyDeleted || !descriptor->GetIsFixed())
                {
                    return false;
                }
                T dataSlot = descriptor->template GetDataPropertyIndex<false>();
                if (dataSlot != NoSlots)
                {
                    Assert(!IsInternalPropertyId(propertyRecord->GetPropertyId()));
                    Var value = localSingletonInstance->GetSlot(dataSlot);
                    if (value && ((IsFixedMethodProperty(propertyType) && VarIs<JavascriptFunction>(value)) || IsFixedDataProperty(propertyType)))
                    {
                        *pProperty = value;
                        if (markAsUsed)
                        {
                            descriptor->SetUsedAsFixed(true);
                        }
                        return true;
                    }
                }
            }
            else
            {
                AssertMsg(allowNonExistent, "Trying to get a fixed function instance for a non-existent property?");
            }
        }

        return false;
    }